

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

void __thiscall
leveldb::DBImpl::GetApproximateSizes(DBImpl *this,Range *range,int n,uint64_t *sizes)

{
  Version *this_00;
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  ulong uVar4;
  ulong uVar5;
  InternalKey k1;
  InternalKey k2;
  
  std::mutex::lock(&(this->mutex_).mu_);
  this_00 = this->versions_->current_;
  Version::Ref(this_00);
  uVar4 = 0;
  uVar5 = (ulong)(uint)n;
  if (n < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    InternalKey::InternalKey(&k1,&range->start,0xffffffffffffff,kTypeValue);
    InternalKey::InternalKey(&k2,&range->limit,0xffffffffffffff,kTypeValue);
    uVar1 = VersionSet::ApproximateOffsetOf(this->versions_,this_00,&k1);
    uVar2 = VersionSet::ApproximateOffsetOf(this->versions_,this_00,&k2);
    uVar3 = 0;
    if (uVar1 <= uVar2) {
      uVar3 = uVar2 - uVar1;
    }
    sizes[uVar4] = uVar3;
    std::__cxx11::string::~string((string *)&k2);
    std::__cxx11::string::~string((string *)&k1);
    range = range + 1;
  }
  Version::Unref(this_00);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return;
}

Assistant:

void DBImpl::GetApproximateSizes(const Range* range, int n, uint64_t* sizes) {
  // TODO(opt): better implementation
  MutexLock l(&mutex_);
  Version* v = versions_->current();
  v->Ref();

  for (int i = 0; i < n; i++) {
    // Convert user_key into a corresponding internal key.
    InternalKey k1(range[i].start, kMaxSequenceNumber, kValueTypeForSeek);
    InternalKey k2(range[i].limit, kMaxSequenceNumber, kValueTypeForSeek);
    uint64_t start = versions_->ApproximateOffsetOf(v, k1);
    uint64_t limit = versions_->ApproximateOffsetOf(v, k2);
    sizes[i] = (limit >= start ? limit - start : 0);
  }

  v->Unref();
}